

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_taylor.cpp
# Opt level: O1

taylor<double,_2,_10> * binomial_generating_function<double,10>(void)

{
  double *pdVar1;
  int i;
  int iVar2;
  taylor<double,_2,_10> *in_RDI;
  int i_1;
  double dVar3;
  taylor<double,_2,_10> tmp_2;
  taylor<double,_2,_10> tmp;
  taylor<double,_2,_10> tmp_1;
  taylor<double,_1,_10> local_ad8;
  taylor<double,_2,_10> local_a78;
  double local_868 [2];
  undefined1 local_858 [512];
  double local_658 [66];
  double local_448 [2];
  undefined8 local_438;
  double local_238 [66];
  
  iVar2 = 0;
  memset(local_858,0,0x200);
  memset(local_448,0,0x210);
  local_438 = 0x3ff0000000000000;
  local_868[1] = 1.0;
  local_868[0] = 1.0;
  memset(local_658,0,0x210);
  polymul_internal::taylor_multiplier<double,_2,_10,_10>::mul_set(local_658,local_868,local_448);
  memcpy(&local_a78,local_658,0x210);
  do {
    pdVar1 = taylor<double,_2,_10>::operator[](&local_a78,iVar2);
    *pdVar1 = -*pdVar1;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x42);
  local_a78.super_polynomial<double,_2,_10>.c[0] =
       local_a78.super_polynomial<double,_2,_10>.c[0] + 1.0;
  local_ad8.super_polynomial<double,_1,_10>.c[8] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[9] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[6] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[7] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[4] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[5] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[2] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[3] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[0] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[1] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[10] = 0.0;
  if ((local_a78.super_polynomial<double,_2,_10>.c[0] == 0.0) &&
     (!NAN(local_a78.super_polynomial<double,_2,_10>.c[0]))) {
    __assert_fail("a != 0 && \"1/(a+x) not analytic at a = 0\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/uekstrom[P]libtaylor/taylor_math.hpp"
                  ,0x24,"void inv_taylor(taylor<T, 1, N> &, const T &) [T = double, N = 10]");
  }
  local_ad8.super_polynomial<double,_1,_10>.c[0] =
       1.0 / local_a78.super_polynomial<double,_2,_10>.c[0];
  iVar2 = 1;
  do {
    pdVar1 = taylor<double,_1,_10>::operator[](&local_ad8,iVar2 + -1);
    dVar3 = -*pdVar1 * local_ad8.super_polynomial<double,_1,_10>.c[0];
    pdVar1 = taylor<double,_1,_10>::operator[](&local_ad8,iVar2);
    *pdVar1 = dVar3;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0xb);
  memset(in_RDI,0,0x210);
  memcpy(local_238,&local_a78,0x210);
  local_238[0] = 0.0;
  polymul_internal::composer<double,_2,_10,_10>::compose0
            ((double *)in_RDI,local_238,(double *)&local_ad8);
  return in_RDI;
}

Assistant:

taylor<T, 2, N> binomial_generating_function() {
  taylor<T, 2, N> x(0, 0), y(0, 1);
  return 1 / (1 - (1 + x) * y); // generating function for the binomial coefficients
}